

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

int __thiscall
google::protobuf::Reflection::FieldSize(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  CppType CVar4;
  RepeatedField<int> *pRVar5;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar6;
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"FieldSize",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x43] != (FieldDescriptor)0x1) {
    CVar4 = FieldDescriptor::cpp_type(field);
    switch(CVar4) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      pRVar5 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      break;
    case CPPTYPE_INT64:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      break;
    case CPPTYPE_UINT32:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      break;
    case CPPTYPE_UINT64:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      break;
    case CPPTYPE_DOUBLE:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      break;
    case CPPTYPE_FLOAT:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      break;
    case CPPTYPE_BOOL:
      pRVar5 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      break;
    case CPPTYPE_STRING:
    case CPPTYPE_MESSAGE:
      bVar1 = FieldDescriptor::is_map(field);
      if (bVar1) {
        this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        bVar1 = internal::MapFieldBase::IsRepeatedFieldValid(this_00);
        if (!bVar1) {
          iVar3 = (*this_00->_vptr_MapFieldBase[10])(this_00);
          return iVar3;
        }
        pRVar6 = internal::MapFieldBase::GetRepeatedField(this_00);
      }
      else {
        pRVar6 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      }
      return pRVar6->current_size_;
    default:
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_reflection.cc"
                 ,0x30c);
      other = internal::LogMessage::operator<<(&local_60,"Can\'t get here.");
      internal::LogFinisher::operator=(&local_21,other);
      internal::LogMessage::~LogMessage(&local_60);
      return 0;
    }
    return pRVar5->current_size_;
  }
  uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  iVar3 = internal::ExtensionSet::ExtensionSize
                    ((ExtensionSet *)
                     ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                     *(int *)(field + 0x44));
  return iVar3;
}

Assistant:

int Reflection::FieldSize(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case FieldDescriptor::CPPTYPE_##UPPERCASE: \
    return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          const internal::MapFieldBase& map =
              GetRaw<MapFieldBase>(message, field);
          if (map.IsRepeatedFieldValid()) {
            return map.GetRepeatedField().size();
          } else {
            // No need to materialize the repeated field if it is out of sync:
            // its size will be the same as the map's size.
            return map.size();
          }
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    GOOGLE_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}